

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::verifyResourceList
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resourceList,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *expectedResources)

{
  pointer pbVar1;
  bool bVar2;
  byte bVar3;
  deBool dVar4;
  char *pcVar5;
  long lVar6;
  int ndx;
  long lVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,"GL returned resources:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  lVar6 = 0;
  for (lVar7 = 0;
      pbVar1 = (resourceList->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar7 < (int)((ulong)((long)(resourceList->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5);
      lVar7 = lVar7 + 1) {
    pcVar5 = getDummyZeroUniformName();
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar6),pcVar5);
    if (bVar2) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"\t");
      std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar7);
      std::operator<<(&local_1a8,": ");
      std::operator<<(&local_1a8,
                      (string *)
                      ((long)&(((resourceList->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar6));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
    lVar6 = lVar6 + 0x20;
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,"Expected list of resources:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  lVar7 = 0;
  for (lVar6 = 0;
      lVar6 < (int)((ulong)((long)(expectedResources->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(expectedResources->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 5);
      lVar6 = lVar6 + 1) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,"\t");
    std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar6);
    std::operator<<(&local_1a8,": ");
    std::operator<<(&local_1a8,
                    (string *)
                    ((long)&(((expectedResources->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7
                    ));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    lVar7 = lVar7 + 0x20;
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<(&local_1a8,"Verifying resource list contents.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  lVar7 = 0;
  bVar3 = 0;
  for (lVar6 = 0;
      pbVar1 = (expectedResources->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar6 < (int)((ulong)((long)(expectedResources->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5);
      lVar6 = lVar6 + 1) {
    local_1b0 = (undefined1  [8])
                (resourceList->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    local_1b8._M_current =
         (resourceList->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = de::
            contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_1b0,&local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pbVar1->_M_dataplus)._M_p + lVar7));
    if (!bVar2) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Error, resource list did not contain active resource ");
      std::operator<<(&local_1a8,
                      (string *)
                      ((long)&(((expectedResources->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar7));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      bVar3 = 1;
    }
    lVar7 = lVar7 + 0x20;
  }
  lVar7 = 0;
  lVar6 = 0;
  do {
    pbVar1 = (resourceList->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(resourceList->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5) <=
        lVar6) {
      return (bool)(~bVar3 & 1);
    }
    local_1b0 = (undefined1  [8])
                (expectedResources->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    local_1b8._M_current =
         (expectedResources->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = de::
            contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_1b0,&local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pbVar1->_M_dataplus)._M_p + lVar7));
    if (!bVar2) {
      dVar4 = deStringBeginsWith(*(char **)((long)&(((resourceList->
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar7),"gl_");
      if (dVar4 == 0) {
        pbVar1 = (resourceList->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar5 = getDummyZeroUniformName();
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(pbVar1->_M_dataplus)._M_p + lVar7),pcVar5);
        if (bVar2) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"Error, resource list contains unexpected resource name ");
          std::operator<<(&local_1a8,
                          (string *)
                          ((long)&(((resourceList->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar7));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          bVar3 = 1;
          goto LAB_012f1e8e;
        }
      }
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Note, resource list contains unknown built-in ");
      std::operator<<(&local_1a8,
                      (string *)
                      ((long)&(((resourceList->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar7));
      std::operator<<(&local_1a8,". This variable is ignored.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
LAB_012f1e8e:
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + 0x20;
  } while( true );
}

Assistant:

bool ResourceListTestCase::verifyResourceList (const std::vector<std::string>& resourceList, const std::vector<std::string>& expectedResources)
{
	bool error = false;

	// Log and compare resource lists

	m_testCtx.getLog() << tcu::TestLog::Message << "GL returned resources:" << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)resourceList.size(); ++ndx)
	{
		// dummyZero is a uniform that may be added by
		// generateProgramInterfaceProgramSources.  Omit it here to avoid
		// confusion about the output.
		if (resourceList[ndx] != getDummyZeroUniformName())
			m_testCtx.getLog() << tcu::TestLog::Message << "\t" << ndx << ": " << resourceList[ndx] << tcu::TestLog::EndMessage;
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Expected list of resources:" << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)expectedResources.size(); ++ndx)
		m_testCtx.getLog() << tcu::TestLog::Message << "\t" << ndx << ": " << expectedResources[ndx] << tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying resource list contents." << tcu::TestLog::EndMessage;

	for (int ndx = 0; ndx < (int)expectedResources.size(); ++ndx)
	{
		if (!de::contains(resourceList.begin(), resourceList.end(), expectedResources[ndx]))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, resource list did not contain active resource " << expectedResources[ndx] << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	for (int ndx = 0; ndx < (int)resourceList.size(); ++ndx)
	{
		if (!de::contains(expectedResources.begin(), expectedResources.end(), resourceList[ndx]))
		{
			// Ignore all builtin variables or the variable dummyZero,
			// mismatch causes errors otherwise.  dummyZero is a uniform that
			// may be added by generateProgramInterfaceProgramSources.
			if (deStringBeginsWith(resourceList[ndx].c_str(), "gl_") == DE_FALSE &&
				resourceList[ndx] != getDummyZeroUniformName())
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, resource list contains unexpected resource name " << resourceList[ndx] << tcu::TestLog::EndMessage;
				error = true;
			}
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Note, resource list contains unknown built-in " << resourceList[ndx] << ". This variable is ignored." << tcu::TestLog::EndMessage;
		}
	}

	return !error;
}